

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# part_attr.c
# Opt level: O0

exr_result_t
exr_attr_set_float_vector(exr_context_t ctxt,int part_index,char *name,int32_t sz,float *val)

{
  undefined8 uVar1;
  exr_context_t ctxt_00;
  int in_ECX;
  exr_attribute_list_t *in_RDX;
  int in_ESI;
  char *in_RDI;
  exr_attribute_t **in_R8;
  exr_attribute_list_t *unaff_retaddr;
  exr_priv_part_t part;
  size_t bytes;
  exr_result_t rv;
  exr_attribute_t *attr;
  exr_const_context_t_conflict in_stack_ffffffffffffffb0;
  exr_const_context_t_conflict c;
  uint in_stack_ffffffffffffffc0;
  exr_context_t ctxt_01;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  exr_result_t eVar2;
  
  ctxt_01 = (exr_context_t)0x0;
  ctxt_00 = (exr_context_t)((long)in_ECX << 2);
  if (in_RDI == (char *)0x0) {
    eVar2 = 2;
  }
  else {
    internal_exr_lock(in_stack_ffffffffffffffb0);
    if ((in_ESI < 0) || (*(int *)(in_RDI + 0xc4) <= in_ESI)) {
      internal_exr_unlock(in_stack_ffffffffffffffb0);
      eVar2 = (**(code **)(in_RDI + 0x48))(in_RDI,4,"Part index (%d) out of range",in_ESI);
    }
    else {
      c = *(exr_const_context_t_conflict *)(*(long *)(in_RDI + 0x1d8) + (long)in_ESI * 8);
      if (*in_RDI == '\0') {
        internal_exr_unlock(c);
        eVar2 = (**(code **)(in_RDI + 0x38))(in_RDI,8);
      }
      else if (*in_RDI == '\x03') {
        internal_exr_unlock(c);
        eVar2 = (**(code **)(in_RDI + 0x38))(in_RDI,0x15);
      }
      else if ((in_ECX < 0) || ((exr_context_t)0x7fffffff < ctxt_00)) {
        internal_exr_unlock(c);
        eVar2 = (**(code **)(in_RDI + 0x48))
                          (in_RDI,3,"Invalid size (%d) for float vector \'%s\'",in_ECX,in_RDX);
      }
      else if (in_R8 == (exr_attribute_t **)0x0) {
        internal_exr_unlock(c);
        eVar2 = (**(code **)(in_RDI + 0x48))
                          (in_RDI,3,"No input values for setting \'%s\', type \'floatvector\'",
                           in_RDX);
      }
      else {
        eVar2 = exr_attr_list_find_by_name
                          ((exr_const_context_t_conflict)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),
                           in_RDX,(char *)CONCAT44(in_ECX,in_stack_ffffffffffffffd8),in_R8);
        if (eVar2 == 0xf) {
          if ((*in_RDI != '\x01') && (*in_RDI != '\x04')) {
            internal_exr_unlock(c);
            return eVar2;
          }
          eVar2 = exr_attr_list_add((exr_context_t)part,unaff_retaddr,
                                    (char *)CONCAT44(in_stack_fffffffffffffffc,
                                                     in_stack_fffffffffffffff8),
                                    (exr_attribute_type_t)((ulong)in_RDI >> 0x20),(int32_t)in_RDI,
                                    (uint8_t **)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),
                                    (exr_attribute_t **)attr);
          if (eVar2 == 0) {
            eVar2 = exr_attr_float_vector_create
                              (ctxt_01,(exr_attr_float_vector_t *)(ulong)in_stack_ffffffffffffffc0,
                               (float *)ctxt_00,(int32_t)((ulong)c >> 0x20));
          }
        }
        else if (eVar2 == 0) {
          if (*(int *)((long)&(ctxt_01->filename).str + 4) != 9) {
            internal_exr_unlock(c);
            uVar1._0_4_ = (ctxt_01->filename).length;
            uVar1._4_4_ = (ctxt_01->filename).alloc_size;
            eVar2 = (**(code **)(in_RDI + 0x48))
                              (in_RDI,0x10,
                               "\'%s\' requested type \'floatvector\', but attribute is type \'%s\'"
                               ,in_RDX,uVar1);
            return eVar2;
          }
          if ((**(int **)&ctxt_01->tmp_filename == in_ECX) &&
             (0 < *(int *)(*(long *)&ctxt_01->tmp_filename + 4))) {
            memcpy(*(void **)(*(long *)&ctxt_01->tmp_filename + 8),in_R8,(size_t)ctxt_00);
          }
          else {
            if ((*in_RDI != '\x01') && (*in_RDI != '\x04')) {
              internal_exr_unlock(c);
              eVar2 = (**(code **)(in_RDI + 0x48))
                                (in_RDI,0x14,
                                 "Existing float vector \'%s\' has %d, requested %d, unable to change"
                                 ,in_RDX,**(undefined4 **)&ctxt_01->tmp_filename,in_ECX);
              return eVar2;
            }
            exr_attr_float_vector_destroy(ctxt_00,(exr_attr_float_vector_t *)c);
            eVar2 = exr_attr_float_vector_create
                              (ctxt_01,(exr_attr_float_vector_t *)
                                       CONCAT44(eVar2,in_stack_ffffffffffffffc0),(float *)ctxt_00,
                               (int32_t)((ulong)c >> 0x20));
          }
        }
        internal_exr_unlock(c);
      }
    }
  }
  return eVar2;
}

Assistant:

exr_result_t
exr_attr_set_float_vector (
    exr_context_t ctxt,
    int           part_index,
    const char*   name,
    int32_t       sz,
    const float*  val)
{
    exr_attribute_t* attr  = NULL;
    exr_result_t     rv    = EXR_ERR_SUCCESS;
    size_t           bytes = (size_t) sz * sizeof (float);

    EXR_LOCK_AND_DEFINE_PART (part_index);

    if (ctxt->mode == EXR_CONTEXT_READ)
        return EXR_UNLOCK_AND_RETURN (
            ctxt->standard_error (ctxt, EXR_ERR_NOT_OPEN_WRITE));
    if (ctxt->mode == EXR_CONTEXT_WRITING_DATA)
        return EXR_UNLOCK_AND_RETURN (
            ctxt->standard_error (ctxt, EXR_ERR_ALREADY_WROTE_ATTRS));

    if (sz < 0 || bytes > (size_t) INT32_MAX)
        return EXR_UNLOCK_AND_RETURN (ctxt->print_error (
            ctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Invalid size (%d) for float vector '%s'",
            sz,
            name));

    if (!val)
        return EXR_UNLOCK_AND_RETURN (ctxt->print_error (
            ctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "No input values for setting '%s', type 'floatvector'",
            name));

    rv = exr_attr_list_find_by_name (
        ctxt, (exr_attribute_list_t*) &(part->attributes), name, &attr);

    if (rv == EXR_ERR_NO_ATTR_BY_NAME)
    {
        if (ctxt->mode != EXR_CONTEXT_WRITE && ctxt->mode != EXR_CONTEXT_TEMPORARY)
            return EXR_UNLOCK_AND_RETURN (rv);

        rv = exr_attr_list_add (
            ctxt,
            &(part->attributes),
            name,
            EXR_ATTR_FLOAT_VECTOR,
            0,
            NULL,
            &(attr));
        if (rv == EXR_ERR_SUCCESS)
            rv =
                exr_attr_float_vector_create (ctxt, attr->floatvector, val, sz);
    }
    else if (rv == EXR_ERR_SUCCESS)
    {
        if (attr->type != EXR_ATTR_FLOAT_VECTOR)
            return EXR_UNLOCK_AND_RETURN (ctxt->print_error (
                ctxt,
                EXR_ERR_ATTR_TYPE_MISMATCH,
                "'%s' requested type 'floatvector', but attribute is type '%s'",
                name,
                attr->type_name));
        if (attr->floatvector->length == sz &&
            attr->floatvector->alloc_size > 0)
        {
            memcpy (EXR_CONST_CAST (void*, attr->floatvector->arr), val, bytes);
        }
        else if (ctxt->mode != EXR_CONTEXT_WRITE && ctxt->mode != EXR_CONTEXT_TEMPORARY)
        {
            return EXR_UNLOCK_AND_RETURN (ctxt->print_error (
                ctxt,
                EXR_ERR_MODIFY_SIZE_CHANGE,
                "Existing float vector '%s' has %d, requested %d, unable to change",
                name,
                attr->floatvector->length,
                sz));
        }
        else
        {
            exr_attr_float_vector_destroy (ctxt, attr->floatvector);
            rv =
                exr_attr_float_vector_create (ctxt, attr->floatvector, val, sz);
        }
    }
    return EXR_UNLOCK_AND_RETURN (rv);
}